

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_critbit.c
# Opt level: O1

void test_empty(CuTest *tc)

{
  char *actual;
  critbit_tree cb;
  critbit_tree local_20;
  
  local_20.root = (void *)0x0;
  actual = (char *)cb_find(&local_20,"herpderp",9);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xd,(char *)0x0,(char *)0x0,actual);
  cb_clear(&local_20);
  CuAssertPtrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0xf,(char *)0x0,(void *)0x0,local_20.root);
  return;
}

Assistant:

static void test_empty(CuTest * tc)
{
  critbit_tree cb = CRITBIT_TREE();
  const char * str;

  str = (const char *)cb_find_str(&cb, "herpderp");
  CuAssertStrEquals(tc, NULL, str);
  cb_clear(&cb);
  CuAssertPtrEquals(tc, NULL, cb.root);
}